

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

void read_palette_mode_info(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  PALETTE_MODE_INFO *colors;
  od_ec_dec *poVar1;
  aom_cdf_prob *paVar2;
  ushort uVar3;
  aom_bit_depth_t aVar4;
  MB_MODE_INFO *pMVar5;
  FRAME_CONTEXT *pFVar6;
  short sVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  byte bVar13;
  byte bVar14;
  ushort uVar15;
  int iVar16;
  MB_MODE_INFO *left_mi;
  uint8_t uVar17;
  uint16_t uVar18;
  int literal;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  int literal_3;
  int iVar22;
  aom_cdf_prob (*paaVar23) [3];
  aom_cdf_prob (*paaVar24) [8];
  int literal_1;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  int n_cached_colors;
  uint16_t cached_colors [8];
  uint16_t color_cache [16];
  uint16_t local_78 [8];
  ulong local_68;
  aom_reader *local_60;
  uint16_t local_58 [20];
  
  uVar17 = cm->seq_params->monochrome;
  pMVar5 = *xd->mi;
  colors = &pMVar5->palette_mode_info;
  bVar14 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[pMVar5->bsize];
  iVar16 = bVar14 - 6;
  if (pMVar5->mode == '\0') {
    uVar8 = 0;
    if (xd->above_mbmi != (MB_MODE_INFO *)0x0) {
      uVar8 = (uint)((xd->above_mbmi->palette_mode_info).palette_size[0] != '\0');
    }
    if (xd->left_mbmi != (MB_MODE_INFO *)0x0) {
      uVar8 = (uVar8 + 1) - (uint)((xd->left_mbmi->palette_mode_info).palette_size[0] == '\0');
    }
    pFVar6 = xd->tile_ctx;
    paaVar23 = pFVar6->palette_y_mode_cdf[(ulong)bVar14 - 6] + uVar8;
    poVar1 = &r->ec;
    iVar9 = od_ec_decode_cdf_q15(poVar1,*paaVar23,2);
    if (r->allow_update_cdf != '\0') {
      uVar15 = pFVar6->palette_y_mode_cdf[(ulong)bVar14 - 6][uVar8][2];
      bVar13 = (char)(uVar15 >> 4) + 4;
      uVar3 = (*paaVar23)[0];
      if ((char)iVar9 < '\x01') {
        sVar7 = -(uVar3 >> (bVar13 & 0x1f));
      }
      else {
        sVar7 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar13 & 0x1f));
      }
      (*paaVar23)[0] = sVar7 + uVar3;
      pFVar6->palette_y_mode_cdf[(ulong)bVar14 - 6][uVar8][2] = uVar15 + (uVar15 < 0x20);
    }
    if (iVar9 != 0) {
      pFVar6 = xd->tile_ctx;
      paaVar24 = pFVar6->palette_y_size_cdf + ((ulong)bVar14 - 6);
      iVar9 = od_ec_decode_cdf_q15(poVar1,*paaVar24,7);
      if (r->allow_update_cdf != '\0') {
        uVar15 = pFVar6->palette_y_size_cdf[(ulong)bVar14 - 6][7];
        bVar13 = (char)(uVar15 >> 4) + 5;
        lVar21 = 0;
        do {
          uVar3 = (*paaVar24)[lVar21];
          if (lVar21 < (char)iVar9) {
            sVar7 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar13 & 0x1f));
          }
          else {
            sVar7 = -(uVar3 >> (bVar13 & 0x1f));
          }
          (*paaVar24)[lVar21] = sVar7 + uVar3;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 6);
        paVar2 = pFVar6->palette_y_size_cdf[(ulong)bVar14 - 6] + 7;
        *paVar2 = *paVar2 + (ushort)(uVar15 < 0x20);
      }
      (pMVar5->palette_mode_info).palette_size[0] = (char)iVar9 + '\x02';
      aVar4 = cm->seq_params->bit_depth;
      local_60 = r;
      uVar8 = av1_get_palette_cache(xd,0,local_58);
      bVar14 = (pMVar5->palette_mode_info).palette_size[0];
      bVar30 = bVar14 != 0;
      uVar19 = (uint)bVar14;
      if ((int)uVar8 < 1) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        if (bVar14 != 0) {
          uVar20 = 0;
          uVar29 = 1;
          do {
            iVar9 = od_ec_decode_bool_q15(poVar1,0x4000);
            if (iVar9 != 0) {
              iVar9 = (int)uVar20;
              uVar20 = (ulong)(iVar9 + 1);
              local_78[iVar9] = local_58[uVar29 - 1];
            }
            bVar30 = (int)uVar20 < (int)uVar19;
          } while ((uVar29 < uVar8) && (uVar29 = uVar29 + 1, (int)uVar20 < (int)uVar19));
        }
      }
      if (bVar30) {
        uVar8 = 0;
        uVar18 = 0;
        local_68 = uVar20;
        if (0 < (int)aVar4) {
          uVar26 = aVar4 + 1;
          do {
            iVar9 = od_ec_decode_bool_q15(poVar1,0x4000);
            uVar8 = uVar8 | iVar9 << ((char)uVar26 - 2U & 0x1f);
            uVar18 = (uint16_t)uVar8;
            uVar26 = uVar26 - 1;
          } while (1 < uVar26);
        }
        iVar9 = (int)local_68;
        colors->palette_colors[iVar9] = uVar18;
        if (iVar9 + 1 < (int)uVar19) {
          uVar8 = 0;
          uVar19 = 3;
          do {
            iVar10 = od_ec_decode_bool_q15(poVar1,0x4000);
            uVar8 = uVar8 | iVar10 << ((char)uVar19 - 2U & 0x1f);
            uVar19 = uVar19 - 1;
          } while (1 < uVar19);
          iVar11 = 1 << ((byte)aVar4 & 0x1f);
          iVar27 = ~(uint)colors->palette_colors[iVar9] + iVar11;
          iVar10 = uVar8 + aVar4 + -3;
          iVar11 = iVar11 + -1;
          lVar21 = (long)(iVar9 + 1);
          do {
            iVar9 = 1;
            if (0 < iVar10) {
              uVar8 = iVar10 + 1;
              uVar19 = 0;
              do {
                iVar9 = od_ec_decode_bool_q15(poVar1,0x4000);
                uVar19 = uVar19 | iVar9 << ((char)uVar8 - 2U & 0x1f);
                uVar8 = uVar8 - 1;
              } while (1 < uVar8);
              iVar9 = uVar19 + 1;
            }
            uVar8 = (uint)(pMVar5->palette_mode_info).palette_colors[lVar21 + -1];
            iVar9 = iVar9 + uVar8;
            iVar12 = iVar11;
            if (iVar9 < iVar11) {
              iVar12 = iVar9;
            }
            uVar15 = (ushort)iVar12;
            if (iVar9 < 0) {
              uVar15 = 0;
            }
            iVar9 = uVar8 - uVar15;
            uVar19 = (iVar27 + iVar9) - 1;
            iVar27 = iVar9 + iVar27;
            uVar8 = 0x1f;
            if (uVar19 != 0) {
              for (; uVar19 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            iVar9 = (uVar8 ^ 0xffffffe0) + 0x21;
            if (iVar27 < 2) {
              iVar9 = 0;
            }
            if (iVar9 <= iVar10) {
              iVar10 = iVar9;
            }
            colors->palette_colors[lVar21] = uVar15;
            lVar21 = lVar21 + 1;
          } while ((uint)lVar21 != (uint)bVar14);
        }
        merge_colors(colors->palette_colors,local_78,(uint)bVar14,(int)local_68);
        r = local_60;
      }
      else {
        memcpy(colors,local_78,(ulong)(uVar19 * 2));
        r = local_60;
      }
    }
  }
  if (((uVar17 == '\0') && (pMVar5->uv_mode == '\0')) && (xd->is_chroma_ref == true)) {
    paaVar23 = xd->tile_ctx->palette_uv_mode_cdf +
               ((pMVar5->palette_mode_info).palette_size[0] != '\0');
    poVar1 = &r->ec;
    iVar9 = od_ec_decode_cdf_q15(poVar1,*paaVar23,2);
    if (r->allow_update_cdf != '\0') {
      uVar15 = (*paaVar23)[2];
      bVar14 = (char)(uVar15 >> 4) + 4;
      uVar3 = (*paaVar23)[0];
      if ((char)iVar9 < '\x01') {
        sVar7 = -(uVar3 >> (bVar14 & 0x1f));
      }
      else {
        sVar7 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar14 & 0x1f));
      }
      (*paaVar23)[0] = sVar7 + uVar3;
      (*paaVar23)[2] = uVar15 + (uVar15 < 0x20);
    }
    if (iVar9 != 0) {
      pFVar6 = xd->tile_ctx;
      paaVar24 = pFVar6->palette_uv_size_cdf + iVar16;
      iVar9 = od_ec_decode_cdf_q15(poVar1,*paaVar24,7);
      if (r->allow_update_cdf != '\0') {
        uVar15 = pFVar6->palette_uv_size_cdf[iVar16][7];
        bVar14 = (char)(uVar15 >> 4) + 5;
        lVar21 = 0;
        do {
          uVar3 = (*paaVar24)[lVar21];
          if (lVar21 < (char)(byte)iVar9) {
            sVar7 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar14 & 0x1f));
          }
          else {
            sVar7 = -(uVar3 >> (bVar14 & 0x1f));
          }
          (*paaVar24)[lVar21] = sVar7 + uVar3;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 6);
        paVar2 = pFVar6->palette_uv_size_cdf[iVar16] + 7;
        *paVar2 = *paVar2 + (ushort)(uVar15 < 0x20);
      }
      uVar17 = (uint8_t)(iVar9 + 2U);
      (pMVar5->palette_mode_info).palette_size[1] = uVar17;
      aVar4 = cm->seq_params->bit_depth;
      uVar19 = iVar9 + 2U & 0xff;
      uVar8 = av1_get_palette_cache(xd,1,local_58);
      bVar30 = uVar17 != '\0';
      iVar16 = 0;
      if ((0 < (int)uVar8) && (uVar17 != '\0')) {
        iVar16 = 0;
        uVar20 = 1;
        do {
          iVar10 = od_ec_decode_bool_q15(poVar1,0x4000);
          if (iVar10 != 0) {
            lVar21 = (long)iVar16;
            iVar16 = iVar16 + 1;
            local_78[lVar21] = local_58[uVar20 - 1];
          }
          bVar30 = iVar16 < (int)uVar19;
        } while ((uVar20 < uVar8) && (uVar20 = uVar20 + 1, iVar16 < (int)uVar19));
      }
      if (bVar30) {
        uVar8 = 0;
        uVar18 = 0;
        if (0 < (int)aVar4) {
          uVar26 = aVar4 + 1;
          do {
            iVar10 = od_ec_decode_bool_q15(poVar1,0x4000);
            uVar8 = uVar8 | iVar10 << ((char)uVar26 - 2U & 0x1f);
            uVar18 = (uint16_t)uVar8;
            uVar26 = uVar26 - 1;
          } while (1 < uVar26);
        }
        colors->palette_colors[iVar16 + 8] = uVar18;
        if (iVar16 + 9 < (int)(uVar19 + 8)) {
          uVar8 = 0;
          uVar26 = 3;
          do {
            iVar10 = od_ec_decode_bool_q15(poVar1,0x4000);
            uVar8 = uVar8 | iVar10 << ((char)uVar26 - 2U & 0x1f);
            uVar26 = uVar26 - 1;
          } while (1 < uVar26);
          iVar27 = 1 << ((byte)aVar4 & 0x1f);
          iVar11 = iVar27 - (uint)colors->palette_colors[iVar16 + 8];
          iVar10 = aVar4 + uVar8 + -3;
          iVar27 = iVar27 + -1;
          lVar21 = (long)(iVar16 + 9);
          do {
            uVar8 = 0;
            if (0 < iVar10) {
              uVar26 = iVar10 + 1;
              uVar8 = 0;
              do {
                iVar12 = od_ec_decode_bool_q15(poVar1,0x4000);
                uVar8 = uVar8 | iVar12 << ((char)uVar26 - 2U & 0x1f);
                uVar26 = uVar26 - 1;
              } while (1 < uVar26);
            }
            uVar26 = (uint)(pMVar5->palette_mode_info).palette_colors[lVar21 + -1];
            iVar22 = uVar8 + uVar26;
            iVar12 = iVar27;
            if (iVar22 < iVar27) {
              iVar12 = iVar22;
            }
            uVar15 = (ushort)iVar12;
            if (iVar22 < 0) {
              uVar15 = 0;
            }
            iVar12 = uVar26 - uVar15;
            uVar26 = (iVar12 + iVar11) - 1;
            iVar11 = iVar12 + iVar11;
            uVar8 = 0x1f;
            if (uVar26 != 0) {
              for (; uVar26 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            iVar12 = (uVar8 ^ 0xffffffe0) + 0x21;
            if (iVar11 < 2) {
              iVar12 = 0;
            }
            if (iVar12 <= iVar10) {
              iVar10 = iVar12;
            }
            colors->palette_colors[lVar21] = uVar15;
            lVar21 = lVar21 + 1;
          } while (uVar19 + 8 != (int)lVar21);
        }
        merge_colors((pMVar5->palette_mode_info).palette_colors + 8,local_78,uVar19,iVar16);
      }
      else {
        memcpy((pMVar5->palette_mode_info).palette_colors + 8,local_78,(ulong)(uVar19 * 2));
      }
      iVar16 = od_ec_decode_bool_q15(poVar1,0x4000);
      if (iVar16 == 0) {
        if (uVar19 != 0) {
          uVar20 = 0;
          do {
            uVar26 = 0;
            uVar18 = 0;
            uVar8 = aVar4 + 1;
            if (0 < (int)aVar4) {
              do {
                iVar16 = od_ec_decode_bool_q15(poVar1,0x4000);
                uVar26 = uVar26 | iVar16 << ((char)uVar8 - 2U & 0x1f);
                uVar18 = (uint16_t)uVar26;
                uVar8 = uVar8 - 1;
              } while (1 < uVar8);
            }
            (pMVar5->palette_mode_info).palette_colors[uVar20 + 0x10] = uVar18;
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar19);
        }
      }
      else {
        uVar8 = 0;
        uVar26 = 3;
        do {
          iVar16 = od_ec_decode_bool_q15(poVar1,0x4000);
          uVar8 = uVar8 | iVar16 << ((char)uVar26 - 2U & 0x1f);
          uVar26 = uVar26 - 1;
        } while (1 < uVar26);
        uVar25 = 1 << ((byte)aVar4 & 0x1f);
        uVar26 = 0;
        uVar18 = 0;
        if (0 < (int)aVar4) {
          uVar28 = aVar4 + 1;
          do {
            iVar16 = od_ec_decode_bool_q15(poVar1,0x4000);
            uVar26 = uVar26 | iVar16 << ((char)uVar28 - 2U & 0x1f);
            uVar18 = (uint16_t)uVar26;
            uVar28 = uVar28 - 1;
          } while (1 < uVar28);
        }
        (pMVar5->palette_mode_info).palette_colors[0x10] = uVar18;
        if ((byte)iVar9 < 0xfe) {
          uVar20 = 1;
          do {
            uVar26 = 0;
            if (0 < (int)(aVar4 + uVar8 + -4)) {
              uVar28 = 0;
              iVar16 = aVar4 + uVar8 + -5;
              do {
                iVar9 = od_ec_decode_bool_q15(poVar1,0x4000);
                uVar28 = uVar28 | iVar9 << ((byte)iVar16 & 0x1f);
                uVar26 = iVar16 + 1;
                iVar16 = iVar16 + -1;
              } while (1 < uVar26);
              if (uVar28 == 0) {
                uVar26 = 0;
              }
              else {
                iVar16 = od_ec_decode_bool_q15(poVar1,0x4000);
                uVar26 = -uVar28;
                if (iVar16 == 0) {
                  uVar26 = uVar28;
                }
              }
            }
            iVar16 = (pMVar5->palette_mode_info).palette_colors[uVar20 + 0xf] + uVar26;
            iVar16 = (iVar16 >> 0x1f & uVar25) + iVar16;
            uVar26 = uVar25;
            if (iVar16 < (int)uVar25) {
              uVar26 = 0;
            }
            (pMVar5->palette_mode_info).palette_colors[uVar20 + 0x10] =
                 (short)iVar16 - (short)uVar26;
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar19);
        }
      }
    }
  }
  return;
}

Assistant:

static void read_palette_mode_info(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                                   aom_reader *r) {
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(av1_allow_palette(cm->features.allow_screen_content_tools, bsize));
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int bsize_ctx = av1_get_palette_bsize_ctx(bsize);

  if (mbmi->mode == DC_PRED) {
    const int palette_mode_ctx = av1_get_palette_mode_ctx(xd);
    const int modev = aom_read_symbol(
        r, xd->tile_ctx->palette_y_mode_cdf[bsize_ctx][palette_mode_ctx], 2,
        ACCT_STR);
    if (modev) {
      pmi->palette_size[0] =
          aom_read_symbol(r, xd->tile_ctx->palette_y_size_cdf[bsize_ctx],
                          PALETTE_SIZES, ACCT_STR) +
          2;
      read_palette_colors_y(xd, cm->seq_params->bit_depth, pmi, r);
    }
  }
  if (num_planes > 1 && mbmi->uv_mode == UV_DC_PRED && xd->is_chroma_ref) {
    const int palette_uv_mode_ctx = (pmi->palette_size[0] > 0);
    const int modev = aom_read_symbol(
        r, xd->tile_ctx->palette_uv_mode_cdf[palette_uv_mode_ctx], 2, ACCT_STR);
    if (modev) {
      pmi->palette_size[1] =
          aom_read_symbol(r, xd->tile_ctx->palette_uv_size_cdf[bsize_ctx],
                          PALETTE_SIZES, ACCT_STR) +
          2;
      read_palette_colors_uv(xd, cm->seq_params->bit_depth, pmi, r);
    }
  }
}